

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall geometry::Group::add_child(Group *this,Primitive *object)

{
  pointer *pppPVar1;
  iterator __position;
  Primitive *local_60;
  BoundingBox local_58;
  
  object->parent = this;
  local_60 = object;
  primitive::Primitive::bounds(&local_58,object);
  core::BoundingBox::add_bounds(&this->m_bounds,&local_58);
  __position._M_current =
       (this->m_children).
       super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_children).
      super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<geometry::primitive::Primitive*,std::allocator<geometry::primitive::Primitive*>>::
    _M_realloc_insert<geometry::primitive::Primitive*const&>
              ((vector<geometry::primitive::Primitive*,std::allocator<geometry::primitive::Primitive*>>
                *)&this->m_children,__position,&local_60);
  }
  else {
    *__position._M_current = local_60;
    pppPVar1 = &(this->m_children).
                super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

void geometry::Group::add_child(geometry::primitive::Primitive *object)
{
    object->parent = this;
    m_bounds.add_bounds(object->bounds());
    m_children.push_back(object);
}